

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O0

void xmlSAX2ElementDecl(void *ctx,xmlChar *name,int type,xmlElementContentPtr content)

{
  uint uVar1;
  xmlElementPtr local_38;
  xmlElementPtr elem;
  xmlParserCtxtPtr ctxt;
  xmlElementContentPtr content_local;
  int type_local;
  xmlChar *name_local;
  void *ctx_local;
  
  if ((ctx != (void *)0x0) && (*(long *)((long)ctx + 0x10) != 0)) {
    if (*(int *)((long)ctx + 0x150) == 1) {
      local_38 = xmlAddElementDecl((xmlValidCtxtPtr)((long)ctx + 0xa0),
                                   *(xmlDtdPtr *)(*(long *)((long)ctx + 0x10) + 0x50),name,type,
                                   content);
    }
    else {
      if (*(int *)((long)ctx + 0x150) != 2) {
        xmlFatalErrMsg((xmlParserCtxtPtr)ctx,XML_ERR_INTERNAL_ERROR,
                       "SAX.xmlSAX2ElementDecl(%s) called while not in subset\n",name,(xmlChar *)0x0
                      );
        return;
      }
      local_38 = xmlAddElementDecl((xmlValidCtxtPtr)((long)ctx + 0xa0),
                                   *(xmlDtdPtr *)(*(long *)((long)ctx + 0x10) + 0x58),name,type,
                                   content);
    }
    if (local_38 == (xmlElementPtr)0x0) {
      *(undefined4 *)((long)ctx + 0x98) = 0;
    }
    if ((((*(int *)((long)ctx + 0x9c) != 0) && (*(int *)((long)ctx + 0x18) != 0)) &&
        (*(long *)((long)ctx + 0x10) != 0)) && (*(long *)(*(long *)((long)ctx + 0x10) + 0x50) != 0))
    {
      uVar1 = xmlValidateElementDecl
                        ((xmlValidCtxtPtr)((long)ctx + 0xa0),*(xmlDocPtr *)((long)ctx + 0x10),
                         local_38);
      *(uint *)((long)ctx + 0x98) = uVar1 & *(uint *)((long)ctx + 0x98);
    }
  }
  return;
}

Assistant:

void
xmlSAX2ElementDecl(void *ctx, const xmlChar * name, int type,
            xmlElementContentPtr content)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;
    xmlElementPtr elem = NULL;

    if ((ctxt == NULL) || (ctxt->myDoc == NULL))
        return;

#ifdef DEBUG_SAX
    xmlGenericError(xmlGenericErrorContext,
                    "SAX.xmlSAX2ElementDecl(%s, %d, ...)\n", name, type);
#endif

    if (ctxt->inSubset == 1)
        elem = xmlAddElementDecl(&ctxt->vctxt, ctxt->myDoc->intSubset,
                                 name, (xmlElementTypeVal) type, content);
    else if (ctxt->inSubset == 2)
        elem = xmlAddElementDecl(&ctxt->vctxt, ctxt->myDoc->extSubset,
                                 name, (xmlElementTypeVal) type, content);
    else {
        xmlFatalErrMsg(ctxt, XML_ERR_INTERNAL_ERROR,
	     "SAX.xmlSAX2ElementDecl(%s) called while not in subset\n",
	               name, NULL);
        return;
    }
#ifdef LIBXML_VALID_ENABLED
    if (elem == NULL)
        ctxt->valid = 0;
    if (ctxt->validate && ctxt->wellFormed &&
        ctxt->myDoc && ctxt->myDoc->intSubset)
        ctxt->valid &=
            xmlValidateElementDecl(&ctxt->vctxt, ctxt->myDoc, elem);
#endif /* LIBXML_VALID_ENABLED */
}